

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

bool __thiscall CS248::Shader::createVertexShader(Shader *this,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  string contents;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  bVar1 = prepareSourceCode(this,filename,&local_30);
  if (bVar1) {
    bVar1 = GLResourceManager::createVertexShader
                      (this->gl_mgr_,local_30._M_dataplus._M_p,&this->vertexShaderId_);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to read ");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool Shader::createVertexShader(const std::string& filename) {
  std::string contents;
  if (!prepareSourceCode(filename, &contents)) {
    cerr << "Failed to read " << filename << endl;
    return false;
  }
  const char* source = contents.c_str();
  if (!gl_mgr_->createVertexShader(source, &vertexShaderId_)) {
    return false;
  }
  return true;
}